

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O2

void ConvertRGBtoUYVY(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  int iVar1;
  uint uVar2;
  Uint8 *pUVar3;
  Uint8 *rgb;
  int yuv [3];
  Uint8 local_3c [4];
  Uint8 local_38;
  Uint8 local_34;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  for (iVar1 = 0; (iVar1 < s->h && (iVar1 < o->h)); iVar1 = iVar1 + 1) {
    rgb = (Uint8 *)((ulong)((uint)s->pitch * iVar1) + (long)s->pixels);
    pUVar3 = *o->pixels + (uint)*o->pitches * iVar1;
    for (uVar2 = 0; ((int)uVar2 < s->w && ((int)uVar2 < o->w)); uVar2 = uVar2 + 1) {
      RGBtoYUV(rgb,(int *)local_3c,monochrome,luminance);
      if ((uVar2 & 1) == 0) {
        *pUVar3 = local_38;
        pUVar3[1] = local_3c[0];
        pUVar3[2] = local_34;
        pUVar3 = pUVar3 + 3;
      }
      else {
        *pUVar3 = local_3c[0];
        pUVar3 = pUVar3 + 1;
      }
      rgb = rgb + s->format->BytesPerPixel;
    }
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoUYVY(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p, yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[1];
				*(op++)=yuv[0];
				*(op++)=yuv[2];
			}
			else
				*(op++)=yuv[0];

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}